

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

int Wlc_PrsRemoveComments(Wlc_Prs_t *p)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  byte bVar8;
  int level;
  byte *pbVar9;
  byte *pbVar10;
  size_t sVar11;
  byte *__s1;
  byte *pbVar12;
  bool bVar13;
  bool bVar14;
  
  if ((long)p->nFileSize < 1) {
    return 1;
  }
  __s1 = (byte *)p->pBuffer;
  pbVar10 = __s1 + p->nFileSize;
  bVar3 = false;
LAB_00372d6a:
  bVar8 = *__s1;
  if (bVar8 < 0x65) {
    pbVar12 = __s1;
    if (bVar8 == 0x2f) {
      if (__s1[1] == 0x2f) {
        if ((((__s1 + 5 < pbVar10) && (__s1[2] == 0x61)) && (__s1[3] == 0x62)) &&
           ((__s1[4] == 99 && (__s1[5] == 0x32)))) {
          __s1[4] = 0x20;
          __s1[5] = 0x20;
          __s1[0] = 0x20;
          __s1[1] = 0x20;
          __s1[2] = 0x20;
          __s1[3] = 0x20;
          goto LAB_00372f5d;
        }
        iVar5 = strncmp((char *)(__s1 + 3),"Pair:",5);
        if (iVar5 == 0) {
          if (p->vPoPairs == (Vec_Str_t *)0x0) {
            pVVar6 = (Vec_Str_t *)malloc(0x10);
            pVVar6->nCap = 100;
            pVVar6->nSize = 0;
            pcVar7 = (char *)malloc(100);
            pVVar6->pArray = pcVar7;
            p->vPoPairs = pVVar6;
          }
          pbVar12 = __s1 + 9;
          do {
            bVar8 = *pbVar12;
            if (bVar8 != 0xd) {
              if (bVar8 == 0x20) {
                pVVar6 = p->vPoPairs;
                uVar1 = pVVar6->nCap;
                if (pVVar6->nSize == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    pVVar6->pArray = pcVar7;
                    sVar11 = 0x10;
                  }
                  else {
                    sVar11 = (ulong)uVar1 * 2;
                    if ((int)sVar11 <= (int)uVar1) goto LAB_003730b0;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(sVar11);
                    }
                    else {
                      pcVar7 = (char *)realloc(pVVar6->pArray,sVar11);
                    }
                    pVVar6->pArray = pcVar7;
                  }
                  pVVar6->nCap = (int)sVar11;
                }
LAB_003730b0:
                bVar8 = 0;
              }
              else {
                if (bVar8 == 10) goto LAB_003730df;
                pVVar6 = p->vPoPairs;
                uVar1 = pVVar6->nCap;
                if (pVVar6->nSize == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    pVVar6->pArray = pcVar7;
                    sVar11 = 0x10;
                  }
                  else {
                    sVar11 = (ulong)uVar1 * 2;
                    if ((int)sVar11 <= (int)uVar1) goto LAB_003730c5;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(sVar11);
                    }
                    else {
                      pcVar7 = (char *)realloc(pVVar6->pArray,sVar11);
                    }
                    pVVar6->pArray = pcVar7;
                  }
                  pVVar6->nCap = (int)sVar11;
                }
              }
LAB_003730c5:
              iVar5 = pVVar6->nSize;
              pVVar6->nSize = iVar5 + 1;
              pVVar6->pArray[iVar5] = bVar8;
            }
            pbVar12 = pbVar12 + 1;
          } while( true );
        }
        bVar4 = true;
        bVar8 = 0x2f;
        do {
          if ((bool)(bVar4 & bVar8 == 10)) goto LAB_00372f33;
          bVar13 = bVar8 != 0x5c;
          bVar14 = bVar8 == 0x20;
          if (!bVar13) {
            bVar14 = bVar13;
          }
          if (bVar4) {
            bVar14 = bVar13;
          }
          bVar4 = bVar14;
          bVar8 = pbVar12[1];
          pbVar12 = pbVar12 + 1;
        } while (bVar8 != 0);
        pbVar12 = (byte *)0x0;
LAB_00372f33:
        if (pbVar12 == (byte *)0x0) {
          pcVar7 = "Cannot find end-of-line after symbols \"//\".";
          goto LAB_00373252;
        }
      }
      else {
        if (__s1[1] != 0x2a) goto LAB_00372e5d;
        pbVar12 = __s1 + -1;
        do {
          pbVar9 = pbVar12;
          if (pbVar9[2] == 0) {
            pbVar12 = (byte *)0x0;
            break;
          }
          pbVar12 = pbVar9 + 1;
        } while ((pbVar9[2] != 0x2f) || (pbVar9[1] != 0x2a));
        if (pbVar12 == (byte *)0x0) {
          pcVar7 = "Cannot find symbols \"*/\" after symbols \"/*\".";
LAB_00373252:
          Wlc_PrsWriteErrorMessage(p,(char *)__s1,pcVar7);
          return 0;
        }
        pbVar12 = pbVar12 + 2;
      }
    }
    else {
      if (bVar8 != 0x60) goto LAB_00372f5d;
      bVar4 = true;
      bVar8 = 0x60;
      do {
        if ((bool)(bVar4 & bVar8 == 10)) goto LAB_00372dc3;
        bVar13 = bVar8 != 0x5c;
        bVar14 = bVar8 == 0x20;
        if (!bVar13) {
          bVar14 = bVar13;
        }
        if (bVar4) {
          bVar14 = bVar13;
        }
        bVar4 = bVar14;
        bVar8 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (bVar8 != 0);
      pbVar12 = (byte *)0x0;
LAB_00372dc3:
      if (pbVar12 == (byte *)0x0) {
        pcVar7 = "Cannot find end-of-line after symbols \"`\".";
        goto LAB_00373252;
      }
    }
    if (__s1 < pbVar12) {
      memset(__s1,0x20,(long)pbVar12 - (long)__s1);
      __s1 = pbVar12;
    }
  }
  else {
LAB_00372e5d:
    if (bVar8 == 0x65) {
      if (((__s1[1] == 0x6e) && (__s1[2] == 100)) &&
         (iVar5 = strncmp((char *)__s1,"endmodule",9), iVar5 == 0)) {
        __s1[9] = 0x3b;
      }
    }
    else if ((((bVar8 == 0x73) && (__s1[1] == 0x70)) && (__s1[2] == 0x65)) &&
            ((iVar5 = strncmp((char *)__s1,"specify",7), iVar5 == 0 && (__s1 < pbVar10 + -10)))) {
      sVar11 = 10;
      pbVar12 = __s1;
      do {
        if (((*pbVar12 == 0x65) && (pbVar12[1] == 0x6e)) && (pbVar12[2] == 100)) {
          pcVar7 = "endspecify";
          pbVar9 = pbVar12;
          iVar5 = strncmp((char *)pbVar12,"endspecify",10);
          level = (int)pbVar9;
          if (iVar5 == 0) {
            if (__s1 < pbVar12 + 10) {
              pcVar7 = (char *)0x20;
              memset(__s1,0x20,sVar11);
              level = (int)__s1;
              __s1 = pbVar12 + 10;
            }
            if (!bVar3) {
              Abc_Print(level,pcVar7);
            }
            bVar3 = true;
            break;
          }
        }
        pbVar12 = pbVar12 + 1;
        sVar11 = sVar11 + 1;
      } while (pbVar12 < pbVar10 + -10);
    }
  }
  goto LAB_00372f5d;
LAB_003730df:
  pVVar6 = p->vPoPairs;
  uVar1 = pVVar6->nSize;
  if ((long)(int)uVar1 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x197,"char Vec_StrEntryLast(Vec_Str_t *)");
  }
  pcVar7 = pVVar6->pArray;
  if (pcVar7[(long)(int)uVar1 + -1] == '\0') goto LAB_00372f5d;
  uVar2 = pVVar6->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,0x10);
      }
      sVar11 = 0x10;
    }
    else {
      sVar11 = (ulong)uVar2 * 2;
      if ((int)sVar11 <= (int)uVar2) goto LAB_003731d3;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar11);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,sVar11);
      }
    }
    pVVar6->pArray = pcVar7;
    pVVar6->nCap = (int)sVar11;
  }
LAB_003731d3:
  iVar5 = pVVar6->nSize;
  pVVar6->nSize = iVar5 + 1;
  pVVar6->pArray[iVar5] = '\0';
LAB_00372f5d:
  if ((*__s1 < 0xe) && ((0x2600U >> (*__s1 & 0x1f) & 1) != 0)) {
    *__s1 = 0x20;
  }
  __s1 = __s1 + 1;
  if (pbVar10 <= __s1) {
    return 1;
  }
  goto LAB_00372d6a;
}

Assistant:

int Wlc_PrsRemoveComments( Wlc_Prs_t * p )
{
    int fSpecifyFound = 0;
    char * pCur, * pNext, * pEnd = p->pBuffer + p->nFileSize;
    for ( pCur = p->pBuffer; pCur < pEnd; pCur++ )
    {
        // regular comment (//)
        if ( *pCur == '/' && pCur[1] == '/' )
        {
            if ( pCur + 5 < pEnd && pCur[2] == 'a' && pCur[3] == 'b' && pCur[4] == 'c' && pCur[5] == '2' )
                pCur[0] = pCur[1] = pCur[2] = pCur[3] = pCur[4] = pCur[5] = ' ';
            else if ( !strncmp(pCur + 3, "Pair:", 5) )
            {
                if ( p->vPoPairs == NULL )
                    p->vPoPairs = Vec_StrAlloc( 100 );
                for ( pNext = pCur + 9; *pNext != '\n'; pNext++ )
                {
                    if ( *pNext == ' ' )
                        Vec_StrPush( p->vPoPairs, '\0' );
                    else if ( *pNext != '\r' )
                        Vec_StrPush( p->vPoPairs, *pNext );
                }
                if ( Vec_StrEntryLast(p->vPoPairs) != 0 )
                    Vec_StrPush(p->vPoPairs, 0);
            }
            else
            {
                pNext = Wlc_PrsFindSymbol( pCur, '\n' );
                if ( pNext == NULL )
                    return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"//\"." );
                for ( ; pCur < pNext; pCur++ )
                    *pCur = ' ';
            }
        }
        // skip preprocessor directive (`timescale, `celldefine, etc)
        else if ( *pCur == '`' )
        {
            pNext = Wlc_PrsFindSymbol( pCur, '\n' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"`\"." );
            for ( ; pCur < pNext; pCur++ )
                *pCur = ' ';
        }
        // regular comment (/* ... */)
        else if ( *pCur == '/' && pCur[1] == '*' )
        {
            pNext = Wlc_PrsFindSymbolTwo( pCur, '*', '/' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find symbols \"*/\" after symbols \"/*\"." );
            // overwrite comment
            for ( ; pCur < pNext + 2; pCur++ )
                *pCur = ' ';
        }
        // 'specify' treated as comments
        else if ( *pCur == 's' && pCur[1] == 'p' && pCur[2] == 'e' && !strncmp(pCur, "specify", 7) )
        {
            for ( pNext = pCur; pNext < pEnd - 10; pNext++ )
                if ( *pNext == 'e' && pNext[1] == 'n' && pNext[2] == 'd' && !strncmp(pNext, "endspecify", 10) )
                {
                    // overwrite comment
                    for ( ; pCur < pNext + 10; pCur++ )
                        *pCur = ' ';
                    if ( fSpecifyFound == 0 )
                        Abc_Print( 0, "Ignoring specify/endspecify directives.\n" );
                    fSpecifyFound = 1;
                    break;
                }
        }
        // insert semicolons
        else if ( *pCur == 'e' && pCur[1] == 'n' && pCur[2] == 'd' && !strncmp(pCur, "endmodule", 9) )
            pCur[strlen("endmodule")] = ';';
        // overwrite end-of-lines with spaces (less checking to do later on)
        if ( *pCur == '\n' || *pCur == '\r'  || *pCur == '\t' )
            *pCur = ' ';
    }
    return 1;
}